

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

void lj_ir_kvalue(lua_State *L,TValue *tv,IRIns *ir)

{
  byte bVar1;
  void *pvVar2;
  lua_State *in_RDX;
  double *in_RSI;
  long in_RDI;
  GCcdata *cd;
  GCcdata *cd_1;
  undefined8 in_stack_fffffffffffffee8;
  
  switch(in_RDX->gct) {
  case '\x16':
    *(uint *)((long)in_RSI + 4) = in_RDX->marked & 0x1f ^ 0xffffffff;
    break;
  case '\x17':
    *in_RSI = (double)(int)(in_RDX->nextgc).gcptr32;
    break;
  case '\x18':
    bVar1 = in_RDX->marked;
    *(uint32_t *)in_RSI = (in_RDX->nextgc).gcptr32;
    *(uint *)((long)in_RSI + 4) = bVar1 & 0x1f ^ 0xffffffff;
    break;
  case '\x19':
  case '\x1a':
    *in_RSI = (double)(in_RDX->nextgc).gcptr32;
    break;
  case '\x1b':
    *in_RSI = 0.0;
    break;
  case '\x1c':
    *in_RSI = *(double *)&in_RDX->glref;
    break;
  case '\x1d':
    pvVar2 = lj_mem_newgco(in_RDX,(GCSize)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    *(undefined1 *)((long)pvVar2 + 5) = 10;
    *(undefined2 *)((long)pvVar2 + 6) = 0xb;
    *(long *)((ulong)*(uint *)(in_RDI + 8) + 0xe0) =
         *(long *)((ulong)*(uint *)(in_RDI + 8) + 0xe0) + 1;
    *(undefined8 *)((long)pvVar2 + 8) = *(undefined8 *)&in_RDX->glref;
    *(uint32_t *)in_RSI = (uint32_t)pvVar2;
    *(uint32_t *)((long)in_RSI + 4) = 0xfffffff5;
  }
  return;
}

Assistant:

void lj_ir_kvalue(lua_State *L, TValue *tv, const IRIns *ir)
{
  UNUSED(L);
  lj_assertL(ir->o != IR_KSLOT, "unexpected KSLOT");  /* Common mistake. */
  switch (ir->o) {
  case IR_KPRI: setpriV(tv, irt_toitype(ir->t)); break;
  case IR_KINT: setintV(tv, ir->i); break;
  case IR_KGC: setgcV(L, tv, ir_kgc(ir), irt_toitype(ir->t)); break;
  case IR_KPTR: case IR_KKPTR:
    setnumV(tv, (lua_Number)(uintptr_t)ir_kptr(ir));
    break;
  case IR_KNULL: setintV(tv, 0); break;
  case IR_KNUM: setnumV(tv, ir_knum(ir)->n); break;
#if LJ_HASFFI
  case IR_KINT64: {
    GCcdata *cd = lj_cdata_new_(L, CTID_INT64, 8);
    *(uint64_t *)cdataptr(cd) = ir_kint64(ir)->u64;
    setcdataV(L, tv, cd);
    break;
    }
#endif
  default: lj_assertL(0, "bad IR constant op %d", ir->o); break;
  }
}